

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

bool __thiscall tinygltf::Value::Has(Value *this,string *key)

{
  const_iterator cVar1;
  
  if (this->type_ == 7) {
    cVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
            ::find(&(this->object_value_)._M_t,key);
    return (_Rb_tree_header *)cVar1._M_node !=
           &(this->object_value_)._M_t._M_impl.super__Rb_tree_header;
  }
  return false;
}

Assistant:

bool IsObject() const { return (type_ == OBJECT_TYPE); }